

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv__inotify_fork(uv_loop_t *loop,watcher_list *root)

{
  int iVar1;
  watcher_root *head;
  uv__queue *puVar2;
  uv__queue *puVar3;
  bool bVar4;
  char *tmp_path;
  uv_fs_event_t *handle;
  uv__queue *q;
  uv__queue queue;
  watcher_list tmp_watcher_list;
  watcher_list *watcher_list;
  watcher_list *tmp_watcher_list_iter;
  int err;
  watcher_list *root_local;
  uv_loop_t *loop_local;
  
  if (root == (watcher_list *)0x0) {
    loop_local._4_4_ = 0;
  }
  else {
    loop->inotify_watchers = root;
    uv__queue_init((uv__queue *)&tmp_watcher_list.entry.rbe_color);
    head = uv__inotify_watchers(loop);
    tmp_watcher_list._64_8_ = watcher_root_RB_MINMAX(head,-1);
    while( true ) {
      bVar4 = false;
      if (tmp_watcher_list._64_8_ != 0) {
        watcher_list = watcher_root_RB_NEXT((watcher_list *)tmp_watcher_list._64_8_);
        bVar4 = tmp_watcher_list._64_8_ != 0;
      }
      if (!bVar4) break;
      *(undefined4 *)(tmp_watcher_list._64_8_ + 0x30) = 1;
      uv__queue_move((uv__queue *)(tmp_watcher_list._64_8_ + 0x20),(uv__queue *)&q);
      while (iVar1 = uv__queue_empty((uv__queue *)&q), iVar1 == 0) {
        puVar2 = uv__queue_head((uv__queue *)&q);
        puVar3 = (uv__queue *)uv__strdup((char *)puVar2[-1].next);
        if (puVar3 == (uv__queue *)0x0) {
          __assert_fail("tmp_path != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                        ,0x931,"int uv__inotify_fork(uv_loop_t *, struct watcher_list *)");
        }
        uv__queue_remove(puVar2);
        uv__queue_insert_tail((uv__queue *)(tmp_watcher_list._64_8_ + 0x20),puVar2);
        uv_fs_event_stop((uv_fs_event_t *)(puVar2 + -7));
        uv__queue_insert_tail((uv__queue *)&tmp_watcher_list.entry.rbe_color,puVar2);
        puVar2[-1].next = puVar3;
      }
      *(undefined4 *)(tmp_watcher_list._64_8_ + 0x30) = 0;
      maybe_free_watcher_list((watcher_list *)tmp_watcher_list._64_8_,loop);
      tmp_watcher_list._64_8_ = watcher_list;
    }
    uv__queue_move((uv__queue *)&tmp_watcher_list.entry.rbe_color,(uv__queue *)&q);
    do {
      iVar1 = uv__queue_empty((uv__queue *)&q);
      if (iVar1 != 0) {
        return 0;
      }
      puVar3 = uv__queue_head((uv__queue *)&q);
      uv__queue_remove(puVar3);
      puVar2 = puVar3[-1].next;
      puVar3[-1].next = (uv__queue *)0x0;
      loop_local._4_4_ =
           uv_fs_event_start((uv_fs_event_t *)(puVar3 + -7),(uv_fs_event_cb)puVar3[-1].prev,
                             (char *)puVar2,0);
      uv__free(puVar2);
    } while (loop_local._4_4_ == 0);
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__inotify_fork(uv_loop_t* loop, struct watcher_list* root) {
  /* Open the inotify_fd, and re-arm all the inotify watchers. */
  int err;
  struct watcher_list* tmp_watcher_list_iter;
  struct watcher_list* watcher_list;
  struct watcher_list tmp_watcher_list;
  struct uv__queue queue;
  struct uv__queue* q;
  uv_fs_event_t* handle;
  char* tmp_path;

  if (root == NULL)
    return 0;

  /* We must restore the old watcher list to be able to close items
   * out of it.
   */
  loop->inotify_watchers = root;

  uv__queue_init(&tmp_watcher_list.watchers);
  /* Note that the queue we use is shared with the start and stop()
   * functions, making uv__queue_foreach unsafe to use. So we use the
   * uv__queue_move trick to safely iterate. Also don't free the watcher
   * list until we're done iterating. c.f. uv__inotify_read.
   */
  RB_FOREACH_SAFE(watcher_list, watcher_root,
                  uv__inotify_watchers(loop), tmp_watcher_list_iter) {
    watcher_list->iterating = 1;
    uv__queue_move(&watcher_list->watchers, &queue);
    while (!uv__queue_empty(&queue)) {
      q = uv__queue_head(&queue);
      handle = uv__queue_data(q, uv_fs_event_t, watchers);
      /* It's critical to keep a copy of path here, because it
       * will be set to NULL by stop() and then deallocated by
       * maybe_free_watcher_list
       */
      tmp_path = uv__strdup(handle->path);
      assert(tmp_path != NULL);
      uv__queue_remove(q);
      uv__queue_insert_tail(&watcher_list->watchers, q);
      uv_fs_event_stop(handle);

      uv__queue_insert_tail(&tmp_watcher_list.watchers, &handle->watchers);
      handle->path = tmp_path;
    }
    watcher_list->iterating = 0;
    maybe_free_watcher_list(watcher_list, loop);
  }

  uv__queue_move(&tmp_watcher_list.watchers, &queue);
  while (!uv__queue_empty(&queue)) {
      q = uv__queue_head(&queue);
      uv__queue_remove(q);
      handle = uv__queue_data(q, uv_fs_event_t, watchers);
      tmp_path = handle->path;
      handle->path = NULL;
      err = uv_fs_event_start(handle, handle->cb, tmp_path, 0);
      uv__free(tmp_path);
      if (err)
        return err;
  }

  return 0;
}